

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepImageIO.cpp
# Opt level: O2

void Imf_3_2::anon_unknown_24::saveLevel(DeepTiledOutputFile *out,DeepImage *img,int x,int y)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  const_iterator cVar3;
  ConstIterator CVar4;
  int iVar5;
  DeepFrameBuffer fb;
  DeepFrameBuffer local_d0;
  undefined1 local_68 [56];
  
  iVar1 = (*(img->super_Image)._vptr_Image[6])(img,(ulong)(uint)x,(ulong)(uint)y);
  DeepFrameBuffer::DeepFrameBuffer(&local_d0);
  SampleCountChannel::slice((SampleCountChannel *)local_68);
  Imf_3_2::DeepFrameBuffer::insertSampleCountSlice((Slice *)&local_d0);
  cVar3._M_node = (_Base_ptr)DeepImageLevel::begin((DeepImageLevel *)CONCAT44(extraout_var,iVar1));
  while( true ) {
    CVar4 = DeepImageLevel::end((DeepImageLevel *)CONCAT44(extraout_var,iVar1));
    if ((const_iterator)cVar3._M_node == CVar4._i._M_node) break;
    (**(code **)(**(long **)(cVar3._M_node + 2) + 0x20))(local_68);
    Imf_3_2::DeepFrameBuffer::insert((string *)&local_d0,(DeepSlice *)(cVar3._M_node + 1));
    cVar3._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar3._M_node);
  }
  Imf_3_2::DeepTiledOutputFile::setFrameBuffer((DeepFrameBuffer *)out);
  iVar5 = (int)out;
  iVar1 = Imf_3_2::DeepTiledOutputFile::numXTiles(iVar5);
  iVar2 = Imf_3_2::DeepTiledOutputFile::numYTiles(iVar5);
  Imf_3_2::DeepTiledOutputFile::writeTiles(iVar5,0,iVar1 + -1,0,iVar2 + -1,x);
  std::
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
               *)&local_d0);
  return;
}

Assistant:

void
saveLevel (DeepTiledOutputFile& out, const DeepImage& img, int x, int y)
{
    const DeepImageLevel& level = img.level (x, y);
    DeepFrameBuffer       fb;

    fb.insertSampleCountSlice (level.sampleCounts ().slice ());

    for (DeepImageLevel::ConstIterator i = level.begin (); i != level.end ();
         ++i)
        fb.insert (i.name (), i.channel ().slice ());

    out.setFrameBuffer (fb);
    out.writeTiles (0, out.numXTiles (x) - 1, 0, out.numYTiles (y) - 1, x, y);
}